

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall ON_NurbsSurface::CollapseSide(ON_NurbsSurface *this,int side,ON_3dPoint point)

{
  bool bVar1;
  bool bVar2;
  double *pdVar3;
  int iVar4;
  int j;
  int iVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double in_XMM1_Qa;
  double local_60;
  ON_4dPoint local_58;
  int local_34;
  
  bVar1 = ON_3dPoint::operator==(&point,&ON_3dPoint::UnsetPoint);
  if (!bVar1) {
    if (this->m_cv != (double *)0x0) goto LAB_00549583;
    goto LAB_0054965f;
  }
  switch(side) {
  case 0:
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
    iVar4 = 0;
    break;
  case 1:
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,0);
    iVar4 = 1;
    break;
  case 2:
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,0);
    iVar4 = 1;
    goto LAB_0054949e;
  case 3:
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
    iVar4 = 0;
LAB_0054949e:
    pdVar3 = ON_Interval::operator[]((ON_Interval *)&local_58,iVar4);
    local_60 = *pdVar3;
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,1);
    local_58.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    iVar4 = 1;
    local_58.y = in_XMM1_Qa;
    goto LAB_0054952d;
  default:
    local_58.z = ON_3dPoint::UnsetPoint.z;
    local_58.x = ON_3dPoint::UnsetPoint.x;
    local_58.y = ON_3dPoint::UnsetPoint.y;
    goto LAB_00549549;
  }
  pdVar3 = ON_Interval::operator[]((ON_Interval *)&local_58,iVar4);
  local_60 = *pdVar3;
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
  local_58.x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  iVar4 = 0;
  local_58.y = in_XMM1_Qa;
LAB_0054952d:
  pdVar3 = ON_Interval::operator[]((ON_Interval *)&local_58,iVar4);
  ON_Surface::PointAt((ON_3dPoint *)&local_58,&this->super_ON_Surface,local_60,*pdVar3);
LAB_00549549:
  point.z = local_58.z;
  point.x = local_58.x;
  point.y = local_58.y;
  bVar1 = ON_3dPoint::operator==(&point,&ON_3dPoint::UnsetPoint);
  if (bVar1) {
    return false;
  }
  if (this->m_cv == (double *)0x0) {
    return false;
  }
LAB_00549583:
  if (3 < (uint)side) goto LAB_0054965f;
  iVar4 = this->m_cv_count[0];
  iVar5 = this->m_cv_count[1];
  switch(side) {
  case 0:
    iVar5 = 1;
    local_34 = side;
    break;
  case 1:
    side = iVar4 + -1;
    goto LAB_005495c2;
  case 2:
    local_34 = iVar5 + -1;
    side = 0;
    break;
  case 3:
    iVar4 = 1;
    side = 0;
LAB_005495c2:
    local_34 = 0;
  }
  if (local_34 < iVar5 && side < iVar4) {
    bVar1 = false;
    j = local_34;
    do {
      do {
        bVar2 = GetCV(this,side,j,&local_58);
        if (!bVar2) {
          return bVar1;
        }
        local_58.x = local_58.w * point.x;
        local_58.y = local_58.w * point.y;
        local_58.z = local_58.w * point.z;
        bVar2 = SetCV(this,side,j,&local_58);
        if (!bVar2) {
          return bVar1;
        }
        j = j + 1;
      } while (iVar5 != j);
      side = side + 1;
      bVar1 = iVar4 <= side;
      j = local_34;
    } while (side != iVar4);
  }
  else {
LAB_0054965f:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::CollapseSide(
       int side,
       ON_3dPoint point
       )
{
  if ( point == ON_3dPoint::UnsetPoint )
  {
    point = CornerAt(*this,side);
    if ( point == ON_3dPoint::UnsetPoint )
      return false;
  }

  if ( !m_cv )
    return false;

  int i0 = 0;
  int i1 = m_cv_count[0];
  int j0 = 0;
  int j1 = m_cv_count[1];

  switch (side)
  {
  case 0: // south
    j1 = j0+1;
    break;
  case 1: // east
    i0 = i1-1;
    break;
  case 2: // north
    j0 = j1-1;
    break;
  case 3: // west
    i1 = i0+1;
    break;
  default:
    return false;
    break;
  }

  if ( i0 >= i1 || j0 >= j1 )
    return false;

  int i, j;
  ON_4dPoint cv;
  for ( i = i0; i < i1; i++ ) for ( j = j0; j < j1; j++ )
  {
    if ( !GetCV(i,j,cv) )
      return false;
    cv.x = point.x*cv.w;
    cv.y = point.y*cv.w;
    cv.z = point.z*cv.w;
    if ( !SetCV(i,j,cv) )
      return false;
  }
  return true;
}